

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

int __thiscall CTcPrsGramNodeOr::advance_expansion(CTcPrsGramNodeOr *this)

{
  long in_RDI;
  bool bVar1;
  undefined4 local_4;
  
  *(undefined8 *)(in_RDI + 0x50) = *(undefined8 *)(*(long *)(in_RDI + 0x50) + 0x38);
  bVar1 = *(long *)(in_RDI + 0x50) != 0;
  if (bVar1) {
    (**(code **)(**(long **)(in_RDI + 0x50) + 0x40))();
  }
  else {
    *(undefined8 *)(in_RDI + 0x50) = *(undefined8 *)(in_RDI + 0x40);
    (**(code **)(**(long **)(in_RDI + 0x50) + 0x40))();
  }
  local_4 = (uint)!bVar1;
  return local_4;
}

Assistant:

virtual int advance_expansion()
    {
        /* advance to the next state */
        cur_alt_ = cur_alt_->next_;

        /* 
         *   if that was the last state, wrap back to the first state and
         *   indicate a 'carry'; otherwise, indicate no carry 
         */
        if (cur_alt_ == 0)
        {
            /* we ran out of states - wrap back to the first one */
            cur_alt_ = sub_head_;

            /* initialize expansion in the new subitem */
            cur_alt_->init_expansion();

            /* indicate that we've wrapped and should carry forward */
            return TRUE;
        }
        else
        {
            /* initialize expansion in the new subitem */
            cur_alt_->init_expansion();

            /* this is another valid state - no carry */
            return FALSE;
        }
    }